

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_deconvolution_activation(NetOptimize *this)

{
  int iVar1;
  FILE *__stream;
  bool bVar2;
  reference ppLVar3;
  reference pvVar4;
  size_type sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  float *pfVar8;
  reference pvVar9;
  long in_RDI;
  int top_blob_index_final;
  Clip *clip;
  ReLU *relu;
  Layer *activation;
  Deconvolution *deconvolution;
  int j;
  int top_blob_index;
  int i;
  size_t layer_count;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  float in_stack_fffffffffffffef0;
  float in_stack_fffffffffffffef4;
  Mat *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  Mat local_d0;
  value_type local_90;
  value_type local_38;
  value_type local_30;
  value_type local_28;
  int local_1c;
  value_type local_18;
  int local_14;
  ulong local_10;
  
  local_10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                       ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  local_14 = 0;
  do {
    if (local_10 <= (ulong)(long)local_14) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
               (long)local_14);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    if (!bVar2) {
      ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                           (long)local_14);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar3)->tops,0);
      local_18 = *pvVar4;
      local_1c = local_14;
LAB_0011f4a2:
      do {
        do {
          local_1c = local_1c + 1;
          if (local_10 <= (ulong)(long)local_1c) goto LAB_0011f5bc;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                     (long)local_1c);
          bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                  (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                   in_stack_fffffffffffffee8));
          if (bVar2) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                       (long)local_1c);
            bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                                    ,(char *)CONCAT44(in_stack_fffffffffffffeec,
                                                      in_stack_fffffffffffffee8));
            if (bVar2) {
              std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                         (long)local_1c);
              bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffffef4,
                                                  in_stack_fffffffffffffef0),
                                      (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                       in_stack_fffffffffffffee8));
              if (bVar2) goto LAB_0011f4a2;
            }
          }
          ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_1c);
          sVar5 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar3)->bottoms);
        } while (sVar5 != 1);
        ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_1c);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar3)->bottoms,0);
      } while (*pvVar4 != local_18);
LAB_0011f5bc:
      if ((long)local_1c != local_10) {
        ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_14);
        local_28 = *ppLVar3;
        ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_1c);
        __stream = _stderr;
        local_30 = *ppLVar3;
        uVar6 = std::__cxx11::string::c_str();
        uVar7 = std::__cxx11::string::c_str();
        fprintf(__stream,"fuse_deconvolution_activation %s %s\n",uVar6,uVar7);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8
                                                ));
        if (bVar2) {
          local_38 = local_30;
          if ((*(float *)&local_30[1]._vptr_Layer != 0.0) ||
             (NAN(*(float *)&local_30[1]._vptr_Layer))) {
            *(undefined4 *)((long)&local_28[1].name._M_string_length + 4) = 2;
            ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           (Allocator *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
            ncnn::Mat::operator=
                      (in_stack_fffffffffffffef8,
                       (Mat *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
            ncnn::Mat::~Mat((Mat *)0x11f722);
            in_stack_ffffffffffffff04 = *(float *)&local_38[1]._vptr_Layer;
            pfVar8 = ncnn::Mat::operator[]((Mat *)&local_28[1].name.field_2,0);
            *pfVar8 = in_stack_ffffffffffffff04;
          }
          else {
            *(undefined4 *)((long)&local_28[1].name._M_string_length + 4) = 1;
          }
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                  (char *)CONCAT44(in_stack_fffffffffffffeec,
                                                   in_stack_fffffffffffffee8));
          if (bVar2) {
            local_90 = local_30;
            *(undefined4 *)((long)&local_28[1].name._M_string_length + 4) = 3;
            in_stack_fffffffffffffef8 = &local_d0;
            ncnn::Mat::Mat((Mat *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           (Allocator *)
                           CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
            ncnn::Mat::operator=
                      (in_stack_fffffffffffffef8,
                       (Mat *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
            ncnn::Mat::~Mat((Mat *)0x11f80c);
            in_stack_fffffffffffffef0 = *(float *)&local_90[1]._vptr_Layer;
            pfVar8 = ncnn::Mat::operator[]((Mat *)&local_28[1].name.field_2,0);
            *pfVar8 = in_stack_fffffffffffffef0;
            in_stack_fffffffffffffef4 = *(float *)((long)&local_90[1]._vptr_Layer + 4);
            pfVar8 = ncnn::Mat::operator[]((Mat *)&local_28[1].name.field_2,1);
            *pfVar8 = in_stack_fffffffffffffef4;
          }
          else {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
                                    ,(char *)CONCAT44(in_stack_fffffffffffffeec,
                                                      in_stack_fffffffffffffee8));
            if (bVar2) {
              *(undefined4 *)((long)&local_28[1].name._M_string_length + 4) = 4;
            }
          }
        }
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_30->tops,0);
        iVar1 = *pvVar4;
        in_stack_fffffffffffffee8 = iVar1;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_28->tops,0);
        *pvVar4 = in_stack_fffffffffffffee8;
        in_stack_fffffffffffffeec = local_14;
        pvVar9 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                           ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
                            (long)iVar1);
        pvVar9->producer = in_stack_fffffffffffffeec;
        std::__cxx11::string::operator=((string *)&local_30->type,"ncnnfused");
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_deconvolution_activation()
{
    const size_t layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Deconvolution")
            continue;

        // Deconvolution - Activation
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "ReLU" && layers[j]->type != "Clip" && layers[j]->type != "Sigmoid")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse Deconvolution - Activation to Deconvolution
        ncnn::Deconvolution* deconvolution = (ncnn::Deconvolution*)layers[i];
        ncnn::Layer* activation = layers[j];

        fprintf(stderr, "fuse_deconvolution_activation %s %s\n", deconvolution->name.c_str(), activation->name.c_str());

        if (activation->type == "ReLU")
        {
            ncnn::ReLU* relu = (ncnn::ReLU*)activation;

            if (relu->slope == 0.f)
            {
                deconvolution->activation_type = 1;
            }
            else
            {
                deconvolution->activation_type = 2;
                deconvolution->activation_params = ncnn::Mat(1);
                deconvolution->activation_params[0] = relu->slope;
            }
        }
        else if (activation->type == "Clip")
        {
            ncnn::Clip* clip = (ncnn::Clip*)activation;

            deconvolution->activation_type = 3;
            deconvolution->activation_params = ncnn::Mat(2);
            deconvolution->activation_params[0] = clip->min;
            deconvolution->activation_params[1] = clip->max;
        }
        else if (activation->type == "Sigmoid")
        {
            deconvolution->activation_type = 4;
        }

        int top_blob_index_final = activation->tops[0];
        deconvolution->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        activation->type = "ncnnfused";
    }

    return 0;
}